

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMetricNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  DDLNode *pDVar1;
  int32 iVar2;
  DDLNode *pDVar3;
  char *pcVar4;
  DeadlyImportError *this_00;
  float fVar5;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88 [32];
  Value *local_68;
  Value *val;
  int type;
  allocator local_49;
  string local_48 [8];
  string valName;
  Property *prop;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  if (((node != (DDLNode *)0x0) && (this->m_ctx != (Context *)0x0)) &&
     (pDVar1 = this->m_ctx->m_root, pDVar3 = ODDLParser::DDLNode::getParent(node), pDVar1 == pDVar3)
     ) {
    for (valName.field_2._8_8_ = ODDLParser::DDLNode::getProperties(node);
        valName.field_2._8_8_ != 0;
        valName.field_2._8_8_ = *(undefined8 *)(valName.field_2._8_8_ + 0x18)) {
      if ((*(long *)valName.field_2._8_8_ != 0) && (**(int **)(valName.field_2._8_8_ + 8) == 0xc)) {
        pcVar4 = *(char **)(*(long *)(valName.field_2._8_8_ + 8) + 0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,pcVar4,&local_49);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        val._0_4_ = Grammar::isValidMetricType(pcVar4);
        if (((int)val != -1) &&
           (local_68 = ODDLParser::DDLNode::getValue(node), local_68 != (Value *)0x0)) {
          if (local_68->m_type == ddl_float) {
            fVar5 = ODDLParser::Value::getFloat(local_68);
            this->m_metrics[(int)val].m_floatValue = fVar5;
          }
          else if (local_68->m_type == ddl_int32) {
            iVar2 = ODDLParser::Value::getInt32(local_68);
            this->m_metrics[(int)val].m_intValue = iVar2;
          }
          else {
            if (local_68->m_type != ddl_string) {
              this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_b0,"OpenGEX: invalid data type for Metric node.",&local_b1
                        );
              DeadlyImportError::DeadlyImportError(this_00,&local_b0);
              __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError
                         );
            }
            pcVar4 = ODDLParser::Value::getString(local_68);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_88,pcVar4,&local_89);
            std::__cxx11::string::operator=((string *)(this->m_metrics + (int)val),local_88);
            std::__cxx11::string::~string(local_88);
            std::allocator<char>::~allocator((allocator<char> *)&local_89);
          }
        }
        std::__cxx11::string::~string(local_48);
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleMetricNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node || nullptr == m_ctx ) {
        return;
    }

    if( m_ctx->m_root != node->getParent() ) {
        return;
    }

    Property *prop( node->getProperties() );
    while( nullptr != prop ) {
        if( nullptr != prop->m_key ) {
            if( Value::ddl_string == prop->m_value->m_type ) {
                std::string valName( ( char* ) prop->m_value->m_data );
                int type( Grammar::isValidMetricType( valName.c_str() ) );
                if( Grammar::NoneType != type ) {
                    Value *val( node->getValue() );
                    if( nullptr != val ) {
                        if( Value::ddl_float == val->m_type ) {
                            m_metrics[ type ].m_floatValue = val->getFloat();
                        } else if( Value::ddl_int32 == val->m_type ) {
                            m_metrics[ type ].m_intValue = val->getInt32();
                        } else if( Value::ddl_string == val->m_type ) {
                            m_metrics[type].m_stringValue = std::string( val->getString() );
                        } else {
                            throw DeadlyImportError( "OpenGEX: invalid data type for Metric node." );
                        }
                    }
                }
            }
        }
        prop = prop->m_next;
    }
}